

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_radian_request(REF_GEOM ref_geom,REF_INT geom,REF_DBL *delta_radian)

{
  int iVar1;
  uint uVar2;
  REF_INT *pRVar3;
  REF_ADJ pRVar4;
  REF_ADJ_ITEM pRVar5;
  bool bVar6;
  REF_INT RVar7;
  ulong uVar8;
  REF_DBL RVar9;
  REF_DBL RVar10;
  double dVar11;
  
  if (ref_geom->face_seg_per_rad != (REF_DBL *)0x0) {
    pRVar3 = ref_geom->descr;
    iVar1 = pRVar3[(long)(geom * 6) + 5];
    RVar7 = -1;
    uVar8 = 0xffffffff;
    if (-1 < (long)iVar1) {
      pRVar4 = ref_geom->ref_adj;
      uVar8 = 0xffffffff;
      RVar7 = -1;
      if (iVar1 < pRVar4->nnode) {
        uVar2 = pRVar4->first[iVar1];
        uVar8 = 0xffffffff;
        RVar7 = -1;
        if ((long)(int)uVar2 != -1) {
          RVar7 = pRVar4->item[(int)uVar2].ref;
          uVar8 = (ulong)uVar2;
        }
      }
    }
    bVar6 = false;
    RVar9 = 0.0;
    RVar10 = 100.0;
    while ((int)uVar8 != -1) {
      if ((pRVar3[RVar7 * 6] == 2) &&
         (dVar11 = ref_geom->face_seg_per_rad[(long)pRVar3[(int)(RVar7 * 6 | 1)] + -1],
         -998.0 <= dVar11)) {
        if (dVar11 <= 0.01) goto LAB_0013fd4f;
        if (RVar9 <= dVar11) {
          RVar9 = dVar11;
        }
        bVar6 = true;
      }
      pRVar5 = ref_geom->ref_adj->item;
      uVar8 = (ulong)pRVar5[(int)uVar8].next;
      RVar7 = -1;
      if (uVar8 != 0xffffffffffffffff) {
        RVar7 = pRVar5[uVar8].ref;
      }
    }
    if (bVar6) goto LAB_0013fd0b;
  }
  RVar9 = ref_geom->segments_per_radian_of_curvature;
LAB_0013fd0b:
  RVar10 = 100.0;
  if (0.1 < RVar9) {
    dVar11 = RVar9 * 1e+20;
    if (dVar11 <= -dVar11) {
      dVar11 = -dVar11;
    }
    if (1.0 < dVar11) {
      RVar10 = 1.0 / RVar9;
    }
  }
LAB_0013fd4f:
  *delta_radian = RVar10;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_radian_request(REF_GEOM ref_geom, REF_INT geom,
                                           REF_DBL *delta_radian) {
  REF_INT node, item, face_geom, face;
  REF_DBL segments, face_segments;
  REF_DBL face_set = -998.0;
  REF_DBL face_active = 0.01;
  REF_BOOL turn_off, use_face;
  use_face = REF_FALSE;
  turn_off = REF_FALSE;

  segments = 0.0;

  if (NULL != (ref_geom)->face_seg_per_rad) {
    node = ref_geom_node(ref_geom, geom);
    each_ref_geom_having_node(ref_geom, node, item, face_geom) {
      if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom)) {
        face = ref_geom_id(ref_geom, face_geom) - 1;
        face_segments = ref_geom->face_seg_per_rad[face];
        if (face_segments < face_set) continue;
        if (face_segments > face_active) {
          segments = MAX(segments, face_segments);
          use_face = REF_TRUE;
        } else {
          turn_off = REF_TRUE;
          break;
        }
      }
    }
  }

  if (turn_off) {
    *delta_radian = 100.0;
    return REF_SUCCESS;
  }

  if (!use_face) {
    segments = ref_geom_segments_per_radian_of_curvature(ref_geom);
  }

  if (segments > 0.1 && ref_math_divisible(1.0, segments)) {
    *delta_radian = 1.0 / segments;
  } else {
    *delta_radian = 100.0;
  }

  return REF_SUCCESS;
}